

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.h
# Opt level: O2

string * __thiscall
llvm::detail::join_impl<std::__cxx11::string*>
          (string *__return_storage_ptr__,detail *this,detail *Begin,ulong End)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *I;
  detail *pdVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pdVar1 = this;
  if (this != Begin) {
    for (; pdVar1 != Begin; pdVar1 = pdVar1 + 0x20) {
    }
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    for (this = this + 0x20; this != Begin; this = this + 0x20) {
      std::__cxx11::string::append((char *)__return_storage_ptr__,End);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string join_impl(IteratorT Begin, IteratorT End,
                             StringRef Separator, std::forward_iterator_tag) {
  std::string S;
  if (Begin == End)
    return S;

  size_t Len = (std::distance(Begin, End) - 1) * Separator.size();
  for (IteratorT I = Begin; I != End; ++I)
    Len += (*Begin).size();
  S.reserve(Len);
  S += (*Begin);
  while (++Begin != End) {
    S += Separator;
    S += (*Begin);
  }
  return S;
}